

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  BYTE *source;
  BYTE *pBVar1;
  symbolEncodingType_e sVar2;
  int iVar3;
  uint uVar4;
  size_t err_code_3;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t err_code;
  undefined8 uVar11;
  HUF_repeat local_7c;
  ZSTD_symbolEncodingTypeStats_t local_68;
  seqStore_t *local_48;
  void *local_40;
  ZSTD_CCtx_params *local_38;
  
  source = seqStorePtr->litStart;
  pBVar1 = seqStorePtr->lit;
  local_48 = seqStorePtr;
  local_38 = cctxParams;
  if (cctxParams->literalCompressionMode == ZSTD_lcm_huffman) {
LAB_0068ea6f:
    local_68.LLtype = 0xff;
    local_7c = (prevEntropy->huf).repeatMode;
    memcpy(nextEntropy,prevEntropy,0x404);
LAB_0068eaa5:
    uVar8 = (long)pBVar1 - (long)source;
    uVar9 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar9 = 6;
    }
    sVar2 = set_basic;
    if (uVar8 <= uVar9) goto LAB_0068ec69;
    sVar5 = HIST_count_wksp((uint *)workspace,&local_68.LLtype,source,uVar8,workspace,wkspSize);
    if (0xffffffffffffff88 < sVar5) {
LAB_0068ed58:
      (entropyMetadata->hufMetadata).hufDesSize = sVar5;
      return sVar5;
    }
    sVar2 = set_rle;
    if ((sVar5 == uVar8) || (sVar2 = set_basic, sVar5 <= (uVar8 >> 7) + 4)) goto LAB_0068ec69;
    if (local_7c == HUF_repeat_check) {
      iVar3 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,local_68.LLtype);
      local_7c = (HUF_repeat)(iVar3 != 0);
    }
    memset(nextEntropy,0,0x400);
    uVar4 = HUF_optimalTableLog(0xb,uVar8,local_68.LLtype);
    sVar5 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,local_68.LLtype,uVar4,
                       (void *)((long)workspace + 0x400),wkspSize - 0x400);
    if (0xffffffffffffff88 < sVar5) goto LAB_0068ed58;
    local_40 = (void *)((long)workspace + 0x400);
    sVar6 = HUF_estimateCompressedSize((HUF_CElt *)nextEntropy,(uint *)workspace,local_68.LLtype);
    sVar5 = HUF_writeCTable_wksp
                      ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                       local_68.LLtype,(uint)sVar5,local_40,wkspSize - 0x400);
    if (((local_7c != HUF_repeat_none) &&
        (sVar7 = HUF_estimateCompressedSize
                           ((HUF_CElt *)prevEntropy,(uint *)workspace,local_68.LLtype),
        sVar7 < uVar8)) && (uVar8 <= sVar5 + 0xc || sVar7 <= sVar5 + sVar6)) {
      memcpy(nextEntropy,prevEntropy,0x404);
      sVar2 = set_repeat;
      goto LAB_0068ec69;
    }
    if (uVar8 <= sVar6 + sVar5) goto LAB_0068ea0d;
    (entropyMetadata->hufMetadata).hType = set_compressed;
    (nextEntropy->huf).repeatMode = HUF_repeat_check;
    (entropyMetadata->hufMetadata).hufDesSize = sVar5;
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
  }
  else {
    if (cctxParams->literalCompressionMode == ZSTD_lcm_uncompressed) {
      local_68.LLtype = 0xff;
LAB_0068ea0d:
      memcpy(nextEntropy,prevEntropy,0x404);
      sVar2 = set_basic;
    }
    else {
      if ((cctxParams->cParams).strategy != ZSTD_fast) goto LAB_0068ea6f;
      uVar4 = (cctxParams->cParams).targetLength;
      local_68.LLtype = 0xff;
      local_7c = (prevEntropy->huf).repeatMode;
      memcpy(nextEntropy,prevEntropy,0x404);
      sVar2 = set_basic;
      if (uVar4 == 0) goto LAB_0068eaa5;
    }
LAB_0068ec69:
    (entropyMetadata->hufMetadata).hType = sVar2;
    (entropyMetadata->hufMetadata).hufDesSize = 0;
  }
  lVar10 = (long)local_48->sequences - (long)local_48->sequencesStart;
  if (lVar10 == 0) {
    (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
    uVar11 = 0;
    local_68.MLtype = set_basic;
    local_68.size = 0;
    local_68.lastCountSize = 0;
  }
  else {
    ZSTD_buildSequencesStatistics
              (&local_68,local_48,lVar10 >> 3,&prevEntropy->fse,&nextEntropy->fse,
               (entropyMetadata->fseMetadata).fseTablesBuffer,
               &(entropyMetadata->fseMetadata).field_0x91,(local_38->cParams).strategy,
               (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    if (0xffffffffffffff88 < local_68.size) goto LAB_0068ed34;
    uVar11 = CONCAT44(local_68.Offtype,local_68.LLtype);
  }
  (entropyMetadata->fseMetadata).llType = (int)uVar11;
  (entropyMetadata->fseMetadata).ofType = (int)((ulong)uVar11 >> 0x20);
  (entropyMetadata->fseMetadata).mlType = local_68.MLtype;
  (entropyMetadata->fseMetadata).lastCountSize = local_68.lastCountSize;
LAB_0068ed34:
  (entropyMetadata->fseMetadata).fseTablesSize = local_68.size;
  uVar8 = 0;
  if (0xffffffffffffff88 < local_68.size) {
    uVar8 = local_68.size;
  }
  return uVar8;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(seqStore_t* seqStorePtr,
                             const ZSTD_entropyCTables_t* prevEntropy,
                                   ZSTD_entropyCTables_t* nextEntropy,
                             const ZSTD_CCtx_params* cctxParams,
                                   ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                                   void* workspace, size_t wkspSize)
{
    size_t const litSize = seqStorePtr->lit - seqStorePtr->litStart;
    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_disableLiteralsCompression(cctxParams),
                                            workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}